

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_error.h
# Opt level: O1

ostream * jsonnet::internal::operator<<(ostream *o,LocationRange *loc)

{
  size_type sVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  ostream *poVar4;
  
  sVar1 = (loc->file)._M_string_length;
  if (sVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(o,(loc->file)._M_dataplus._M_p,sVar1);
  }
  if ((loc->begin).line != 0) {
    if ((loc->file)._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(o,":",1);
    }
    if ((loc->begin).line == (loc->end).line) {
      uVar2 = (loc->begin).column;
      uVar3 = (loc->end).column;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)o);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      if (uVar2 != uVar3 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>(o,"-",1);
        std::ostream::_M_insert<unsigned_long>((ulong)o);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(o,"(",1);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)o);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(o,")-(",3);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)o);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(o,")",1);
    }
  }
  return o;
}

Assistant:

static inline std::ostream &operator<<(std::ostream &o, const LocationRange &loc)
{
    if (loc.file.length() > 0)
        o << loc.file;
    if (loc.isSet()) {
        if (loc.file.length() > 0)
            o << ":";
        if (loc.begin.line == loc.end.line) {
            if (loc.begin.column == loc.end.column - 1) {
                o << loc.begin;
            } else {
                o << loc.begin << "-" << loc.end.column;
            }
        } else {
            o << "(" << loc.begin << ")-(" << loc.end << ")";
        }
    }
    return o;
}